

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> * __thiscall
kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>::operator=
          (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *this,
          Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *other)

{
  Task *node;
  Task *ptrCopy;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *other_local;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> *this_local;
  
  node = this->ptr;
  this->ptr = other->ptr;
  other->ptr = (Task *)0x0;
  if (node != (Task *)0x0) {
    kj::_::PromiseDisposer::dispose(&node->super_PromiseArenaMember);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assignnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    T* ptrCopy = ptr;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      StaticDisposer::dispose(ptrCopy);
    }
    return *this;
  }